

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_part.c
# Opt level: O2

int cmime_part_from_file(CMimePart_T **part,char *filename,char *nl)

{
  int iVar1;
  int iVar2;
  int iVar3;
  CMimeInfo_T *mi;
  char *pcVar4;
  FILE *__stream;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  long *plVar8;
  char *__fmt;
  char *pcVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  undefined1 local_f8 [8];
  stat fileinfo;
  uchar out [4];
  char *local_48;
  char *ptemp;
  uchar local_33 [8];
  uchar in [3];
  
  local_48 = (char *)0x0;
  ptemp = (char *)part;
  if (*part == (CMimePart_T *)0x0) {
    __assert_fail("(*part)",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0xea,"int cmime_part_from_file(CMimePart_T **, char *, const char *)");
  }
  if (filename == (char *)0x0) {
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_part.c"
                  ,0xeb,"int cmime_part_from_file(CMimePart_T **, char *, const char *)");
  }
  iVar1 = stat(filename,(stat *)local_f8);
  if (iVar1 == 0) {
    if (((uint)fileinfo.st_nlink & 0xf000) == 0x8000) {
      if (nl == (char *)0x0) {
        nl = _cmime_internal_determine_linebreak_from_file(filename);
      }
      mi = cmime_util_info_get_from_file(filename);
      pcVar9 = mi->mime_encoding;
      iVar1 = strcmp(pcVar9,"binary");
      pcVar4 = mi->mime_type;
      if (iVar1 == 0) {
        pcVar9 = __xpg_basename(filename);
        __fmt = "%s;%s\tname=%s%s";
      }
      else {
        __fmt = "%s;%s\tcharset=%s%s";
      }
      asprintf(&local_48,__fmt,pcVar4,nl,pcVar9,nl);
      cmime_util_info_free(mi);
      cmime_part_set_content_type(*(CMimePart_T **)ptemp,local_48);
      pcVar9 = local_48;
      iVar1 = strncmp(local_48,"text/plain",10);
      if (iVar1 == 0) {
        pcVar4 = strstr(pcVar9,"ascii");
        free(pcVar9);
        pcVar9 = "7bit%s";
        if (pcVar4 == (char *)0x0) {
          pcVar9 = "8bit%s";
        }
      }
      else {
        free(pcVar9);
        pcVar9 = "base64%s";
      }
      asprintf(&local_48,pcVar9,nl);
      pcVar9 = ptemp;
      cmime_part_set_content_transfer_encoding(*(CMimePart_T **)ptemp,local_48);
      free(local_48);
      pcVar4 = __xpg_basename(filename);
      asprintf(&local_48,"attachment;%s\tfilename=%s%s",nl,pcVar4,nl);
      cmime_part_set_content_disposition(*(CMimePart_T **)pcVar9,local_48);
      free(local_48);
      __stream = fopen(filename,"rb");
      if (__stream != (FILE *)0x0) {
        pvVar5 = calloc(1,1);
        *(void **)(*(long *)pcVar9 + 8) = pvVar5;
        uVar12 = 0;
        do {
          iVar10 = 0;
LAB_00109b30:
          do {
            iVar2 = feof(__stream);
            if (iVar2 != 0) {
              iVar10 = fclose(__stream);
              iVar1 = 0;
              if (iVar10 == 0) {
                return 0;
              }
              pcVar9 = "libcmime: error closing file";
              goto LAB_00109d2d;
            }
            iVar2 = 0;
            for (lVar11 = 0; plVar8 = (long *)ptemp, lVar11 != 3; lVar11 = lVar11 + 1) {
              iVar3 = fgetc(__stream);
              local_33[lVar11] = (uchar)iVar3;
              iVar3 = feof(__stream);
              if (iVar3 == 0) {
                iVar2 = iVar2 + 1;
              }
              else {
                local_33[lVar11] = '\0';
              }
            }
            iVar3 = iVar10;
            if (iVar2 == 0) {
LAB_00109c45:
              iVar2 = feof(__stream);
              iVar10 = iVar3;
              if (iVar2 == 0) goto LAB_00109b30;
            }
            else {
              if (iVar1 == 0) {
                uVar12 = (ulong)(int)uVar12;
                pcVar9 = *(char **)(*(long *)ptemp + 8);
                sVar6 = strlen(pcVar9);
                pvVar5 = realloc(pcVar9,sVar6 + 5);
                *(void **)(*plVar8 + 8) = pvVar5;
                for (lVar11 = -3; lVar11 != 0; lVar11 = lVar11 + 1) {
                  *(uchar *)(*(long *)(*plVar8 + 8) + uVar12) = local_33[lVar11 + 3];
                  uVar12 = uVar12 + 1;
                }
              }
              else {
                cmime_base64_encode_block
                          (local_33,(uchar *)((long)fileinfo.__glibc_reserved + 0x14),iVar2);
                plVar8 = (long *)ptemp;
                pcVar9 = *(char **)(*(long *)ptemp + 8);
                sVar6 = strlen(pcVar9);
                pvVar5 = realloc(pcVar9,sVar6 + 6);
                *(void **)(*plVar8 + 8) = pvVar5;
                uVar12 = (ulong)(int)uVar12;
                for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
                  *(undefined1 *)(*(long *)(*plVar8 + 8) + uVar12) =
                       *(undefined1 *)((long)fileinfo.__glibc_reserved + lVar11 + 0x14);
                  uVar12 = uVar12 + 1;
                }
              }
              *(undefined1 *)(*(long *)(*plVar8 + 8) + (long)(int)uVar12) = 0;
              iVar3 = iVar10 + 1;
              if (iVar10 < 0x11) goto LAB_00109c45;
            }
            pcVar9 = ptemp;
            iVar10 = 0;
          } while (iVar3 == 0 || iVar1 == 0);
          pcVar4 = *(char **)(*(long *)ptemp + 8);
          sVar6 = strlen(pcVar4);
          sVar7 = strlen(nl);
          pvVar5 = realloc(pcVar4,sVar6 + sVar7 + 1);
          *(void **)(*(long *)pcVar9 + 8) = pvVar5;
          iVar10 = (int)uVar12;
          lVar11 = (long)iVar10 << 0x20;
          for (uVar12 = 0; sVar6 = strlen(nl), uVar12 < sVar6; uVar12 = uVar12 + 1) {
            *(char *)(uVar12 + *(long *)(*(long *)ptemp + 8) + (long)iVar10) = nl[uVar12];
            lVar11 = lVar11 + 0x100000000;
          }
          uVar12 = (ulong)(uint)(iVar10 + (int)uVar12);
          *(undefined1 *)(*(long *)(*(long *)ptemp + 8) + (lVar11 >> 0x20)) = 0;
        } while( true );
      }
      iVar1 = -3;
      pcVar9 = "libcmime: error opening file";
LAB_00109d2d:
      perror(pcVar9);
    }
    else {
      iVar1 = -2;
    }
  }
  else {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int cmime_part_from_file(CMimePart_T **part, char *filename, const char *nl) {
    struct stat fileinfo;
    int retval = 0;
    FILE *fp = NULL;
    int encode = 0;
    int i = 0;
    int len = 0;
    int blocksout = 0;
    int pos = 0;
    unsigned char in[3], out[4];
    char *ptemp = NULL;
    CMimeInfo_T *mi = NULL;

    assert((*part));
    assert(filename);

    /* only regular files please */
    retval = stat(filename,&fileinfo);
    if (retval == 0) {
        if(S_ISREG(fileinfo.st_mode)) {
            if (nl == NULL) 
                nl = _cmime_internal_determine_linebreak_from_file(filename);
            
            mi = cmime_util_info_get_from_file(filename);
            if (strcmp(mi->mime_encoding,"binary")==0) 
                asprintf(&ptemp,"%s;%s\tname=%s%s",mi->mime_type,nl,basename(filename),nl);
            else 
                asprintf(&ptemp,"%s;%s\tcharset=%s%s",mi->mime_type,nl,mi->mime_encoding,nl);
            
            cmime_util_info_free(mi);
            cmime_part_set_content_type((*part),ptemp);
            encode = (strncmp(ptemp,MIMETYPE_TEXT_PLAIN,strlen(MIMETYPE_TEXT_PLAIN)) == 0) ? 0 : 1;
            
                    
            if (encode == 1) {
                free(ptemp);
                asprintf(&ptemp,"base64%s",nl);
            } else {
                if (strstr(ptemp,"ascii")!=NULL) {
                    free(ptemp);
                    asprintf(&ptemp,"7bit%s",nl);
                } else {
                    free(ptemp);
                    asprintf(&ptemp,"8bit%s",nl);
                }
            }

            cmime_part_set_content_transfer_encoding((*part),ptemp);
            free(ptemp);
            
            asprintf(&ptemp,"attachment;%s\tfilename=%s%s",nl,basename(filename),nl);
            cmime_part_set_content_disposition((*part),ptemp);      
            free(ptemp);
            
            fp = fopen(filename, "rb");
            if (fp != NULL) {
                (*part)->content = (char *)calloc(1,sizeof(char));
                while(!feof(fp)) {
                    len = 0;
                    
                    for(i=0; i<3; i++) {
                        in[i] = (unsigned char)fgetc(fp);

                        if(!feof(fp)) {
                            len++;
                        } else {
                            in[i] = 0;
                        }
                    }

                    if (len) {
                        if (encode == 0) {
                            (*part)->content = (char *)realloc((*part)->content,strlen((*part)->content) + sizeof(in) + sizeof(char) +1);
                            for(i=0; i<3; i++) {
                                (*part)->content[pos++] = in[i];    
                            }
                            (*part)->content[pos] = '\0';
                        } else {
                            cmime_base64_encode_block(in,out,len);
                            (*part)->content = (char *)realloc((*part)->content,strlen((*part)->content) + sizeof(out) + sizeof(char) + 1);
                            for (i=0; i<4;i++) {
                                (*part)->content[pos++] = out[i];
                            }
                            (*part)->content[pos] = '\0';                       
                        }
                        blocksout++;
                    }

                    if(blocksout >= (LINE_LENGTH / 4) || feof(fp)) {
                        if(blocksout && (encode == 1)) {
                            /* if base64 data, we need to do a line break after LINE_LENGTH chars */
                            (*part)->content = (char *)realloc((*part)->content,strlen((*part)->content) + strlen(nl) + sizeof(char));
                            
                            for (i=0; i<strlen(nl);i++) {
                                (*part)->content[pos++] = nl[i];    
                            }
                            (*part)->content[pos] = '\0';
                        }
                    blocksout = 0;
                    } 
                }
                if (fclose(fp)!=0)
                    perror("libcmime: error closing file");
            } else {
                perror("libcmime: error opening file");
                return (-3); /* failed to open file */
            }           
        } else {
            return(-2); /* not regular file */
        } 
    } else {
        return(-1); /* stat error */
    }
    
    return(0);
}